

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderCompilationFailTest::iterate(GeometryShaderCompilationFailTest *this)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  NotSupportedError *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  MessageBuilder local_3b0;
  MessageBuilder local_230;
  char *local_b0;
  char *vs_code_specialized_raw;
  string vs_code_specialized;
  char *gs_code_specialized_raw;
  string gs_code_specialized;
  char *fs_code_specialized_raw;
  string fs_code_specialized;
  Functions *gl;
  bool local_1a;
  bool local_19;
  bool result;
  char *pcStack_18;
  bool has_shader_compilation_failed;
  char *gs_code;
  GeometryShaderCompilationFailTest *this_local;
  
  pcStack_18 = 
  "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (points)                   in;\nlayout (points, max_vertices = 1) out;\n\nvoid main()\n{\n    gl_Position = gl_in[0].gl_Position;\n    mitVertex();\n}\n"
  ;
  local_19 = true;
  gs_code = (char *)this;
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) != 0) {
    pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
    iVar1 = (*pRVar4->_vptr_RenderContext[3])();
    fs_code_specialized.field_2._8_8_ = CONCAT44(extraout_var,iVar1);
    GVar2 = (**(code **)(fs_code_specialized.field_2._8_8_ + 0x3c8))();
    this->m_po_id = GVar2;
    dVar3 = (**(code **)(fs_code_specialized.field_2._8_8_ + 0x800))();
    glu::checkError(dVar3,"glCreateProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x7d2);
    GVar2 = (**(code **)(fs_code_specialized.field_2._8_8_ + 0x3f0))(0x8b30);
    this->m_fs_id = GVar2;
    GVar2 = (**(code **)(fs_code_specialized.field_2._8_8_ + 0x3f0))(0x8dd9);
    this->m_gs_id = GVar2;
    GVar2 = (**(code **)(fs_code_specialized.field_2._8_8_ + 0x3f0))(0x8b31);
    this->m_vs_id = GVar2;
    dVar3 = (**(code **)(fs_code_specialized.field_2._8_8_ + 0x800))();
    glu::checkError(dVar3,"glCreateShader() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x7d9);
    TestCaseBase::specializeShader_abi_cxx11_
              ((string *)&fs_code_specialized_raw,&this->super_TestCaseBase,1,&dummy_fs_code);
    gs_code_specialized.field_2._8_8_ = std::__cxx11::string::c_str();
    TestCaseBase::specializeShader_abi_cxx11_
              ((string *)&gs_code_specialized_raw,&this->super_TestCaseBase,1,
               &stack0xffffffffffffffe8);
    vs_code_specialized.field_2._8_8_ = std::__cxx11::string::c_str();
    TestCaseBase::specializeShader_abi_cxx11_
              ((string *)&vs_code_specialized_raw,&this->super_TestCaseBase,1,&dummy_vs_code);
    local_b0 = (char *)std::__cxx11::string::c_str();
    local_1a = TestCaseBase::buildProgram
                         (&this->super_TestCaseBase,this->m_po_id,this->m_gs_id,1,
                          (char **)((long)&vs_code_specialized.field_2 + 8),this->m_vs_id,1,
                          &local_b0,this->m_fs_id,1,
                          (char **)((long)&gs_code_specialized.field_2 + 8),&local_19);
    if (local_1a) {
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_230,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_230,
                          (char (*) [72])
                          "Program object was linked successfully, whereas a failure was expected.")
      ;
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_230);
    }
    local_1a = !local_1a;
    if ((local_19 & 1U) == 0) {
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_3b0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_3b0,
                          (char (*) [62])
                          "Shader compilation succeeded, whereas a failure was expected.");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3b0);
      local_1a = false;
    }
    if (local_1a) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"Fail");
    }
    std::__cxx11::string::~string((string *)&vs_code_specialized_raw);
    std::__cxx11::string::~string((string *)&gs_code_specialized_raw);
    std::__cxx11::string::~string((string *)&fs_code_specialized_raw);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Geometry shader functionality not supported, skipping","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
             ,0x7ca);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderCompilationFailTest::iterate()
{
	/* Define Vertex Shader's code for the purpose of this test. */
	const char* gs_code = "${VERSION}\n"
						  "${GEOMETRY_SHADER_REQUIRE}\n"
						  "\n"
						  "layout (points)                   in;\n"
						  "layout (points, max_vertices = 1) out;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_Position = gl_in[0].gl_Position;\n"
						  "    mitVertex();\n"
						  "}\n";

	bool has_shader_compilation_failed = true;
	bool result						   = true;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Create a program object */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	/* Create shader objects */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	/* Try to link the test program object */
	std::string fs_code_specialized		= specializeShader(1, &dummy_fs_code);
	const char* fs_code_specialized_raw = fs_code_specialized.c_str();

	std::string gs_code_specialized		= specializeShader(1, &gs_code);
	const char* gs_code_specialized_raw = gs_code_specialized.c_str();

	std::string vs_code_specialized		= specializeShader(1, &dummy_vs_code);
	const char* vs_code_specialized_raw = vs_code_specialized.c_str();

	if (TestCaseBase::buildProgram(m_po_id, m_gs_id, 1,					 /* n_sh1_body_parts */
								   &gs_code_specialized_raw, m_vs_id, 1, /* n_sh2_body_parts */
								   &vs_code_specialized_raw, m_fs_id, 1, /* n_sh3_body_parts */
								   &fs_code_specialized_raw, &has_shader_compilation_failed))
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Program object was linked successfully, whereas a failure was expected."
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	if (!has_shader_compilation_failed)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Shader compilation succeeded, whereas a failure was expected."
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}